

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O1

void vline_tilde_float(t_vline *x,t_float f)

{
  double dVar1;
  t_vseg *ptVar2;
  _vseg *p_Var3;
  t_vseg *ptVar4;
  t_vseg *ptVar5;
  t_vseg **pptVar6;
  t_vseg *fatso;
  double dVar7;
  float fVar8;
  float fVar9;
  t_bigorsmall32 pun;
  
  dVar7 = clock_gettimesince(x->x_referencetime);
  fVar9 = 0.0;
  if ((((uint)f >> 0x1d ^ (uint)f >> 0x1e) & 1) != 0) {
    fVar9 = f;
  }
  if (x->x_inlet2 < 0.0) {
    x->x_value = (double)fVar9;
    vline_tilde_stop(x);
    return;
  }
  fVar8 = 0.0;
  if (0.0 <= x->x_inlet1) {
    fVar8 = x->x_inlet1;
  }
  dVar7 = dVar7 + (double)x->x_inlet2;
  ptVar5 = (t_vseg *)getbytes(0x20);
  pptVar6 = &x->x_list;
  fatso = x->x_list;
  if (fatso != (t_vseg *)0x0) {
    dVar1 = fatso->s_starttime;
    if ((dVar1 <= dVar7) &&
       (((dVar1 != dVar7 || (NAN(dVar1) || NAN(dVar7))) ||
        ((0.0 < fVar8 && (fatso->s_targettime <= dVar1)))))) {
      ptVar2 = fatso->s_next;
      if (ptVar2 == (t_vseg *)0x0) {
LAB_0011a504:
        pptVar6 = &fatso->s_next;
        fatso = (t_vseg *)0x0;
      }
      else {
        dVar1 = ptVar2->s_starttime;
        ptVar4 = fatso;
        fatso = ptVar2;
        while (dVar1 <= dVar7) {
          if (((dVar1 == dVar7) && (!NAN(dVar1) && !NAN(dVar7))) &&
             ((fVar8 <= 0.0 || (dVar1 < fatso->s_targettime)))) break;
          p_Var3 = fatso->s_next;
          if (p_Var3 == (_vseg *)0x0) goto LAB_0011a504;
          ptVar4 = fatso;
          fatso = p_Var3;
          dVar1 = p_Var3->s_starttime;
        }
        pptVar6 = &ptVar4->s_next;
      }
    }
  }
  *pptVar6 = ptVar5;
  while (fatso != (t_vseg *)0x0) {
    p_Var3 = fatso->s_next;
    freebytes(fatso,0x20);
    fatso = p_Var3;
  }
  ptVar5->s_next = (_vseg *)0x0;
  ptVar5->s_target = fVar9;
  ptVar5->s_starttime = dVar7;
  ptVar5->s_targettime = (double)fVar8 + dVar7;
  x->x_inlet1 = 0.0;
  x->x_inlet2 = 0.0;
  return;
}

Assistant:

static void vline_tilde_float(t_vline *x, t_float f)
{
    double timenow = clock_gettimesince(x->x_referencetime);
    t_float inlet1 = (x->x_inlet1 < 0 ? 0 : x->x_inlet1);
    t_float inlet2 = x->x_inlet2;
    double starttime = timenow + inlet2;
    t_vseg *s1, *s2, *deletefrom = 0, *snew;
    if (PD_BIGORSMALL(f))
        f = 0;

        /* negative delay input means stop and jump immediately to new value */
    if (inlet2 < 0)
    {
        x->x_value = f;
        vline_tilde_stop(x);
        return;
    }
    snew = (t_vseg *)t_getbytes(sizeof(*snew));
        /* check if we supplant the first item in the list.  We supplant
        an item by having an earlier starttime, or an equal starttime unless
        the equal one was instantaneous and the new one isn't (in which case
        we'll do a jump-and-slide starting at that time.) */
    if (!x->x_list || x->x_list->s_starttime > starttime ||
        (x->x_list->s_starttime == starttime &&
            (x->x_list->s_targettime > x->x_list->s_starttime || inlet1 <= 0)))
    {
        deletefrom = x->x_list;
        x->x_list = snew;
    }
    else
    {
        for (s1 = x->x_list; (s2 = s1->s_next); s1 = s2)
        {
            if (s2->s_starttime > starttime ||
                (s2->s_starttime == starttime &&
                    (s2->s_targettime > s2->s_starttime || inlet1 <= 0)))
            {
                deletefrom = s2;
                s1->s_next = snew;
                goto didit;
            }
        }
        s1->s_next = snew;
        deletefrom = 0;
    didit: ;
    }
    while (deletefrom)
    {
        s1 = deletefrom->s_next;
        t_freebytes(deletefrom, sizeof(*deletefrom));
        deletefrom = s1;
    }
    snew->s_next = 0;
    snew->s_target = f;
    snew->s_starttime = starttime;
    snew->s_targettime = starttime + inlet1;
    x->x_inlet1 = x->x_inlet2 = 0;
}